

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  int iVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  ulong uVar22;
  Geometry *pGVar23;
  ulong uVar24;
  Scene *pSVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  float fVar33;
  uint uVar34;
  float fVar35;
  float fVar46;
  float fVar49;
  vint4 bi;
  undefined1 auVar36 [16];
  uint uVar47;
  uint uVar50;
  float fVar51;
  uint uVar52;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar53;
  float fVar58;
  float fVar59;
  vint4 bi_1;
  float fVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  float fVar65;
  uint uVar66;
  vint4 ai;
  float fVar67;
  uint uVar68;
  vint4 ai_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar76;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar85;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_11dc;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  RayQueryContext *local_11b0;
  undefined1 local_11a8 [16];
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  Geometry *local_1170;
  long local_1168;
  long local_1160;
  RTCFilterFunctionNArguments local_1158;
  float local_1128;
  float local_1124;
  float local_1120;
  float local_111c;
  float local_1118;
  undefined4 local_1114;
  uint local_1110;
  uint local_110c;
  uint local_1108;
  float local_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  float local_10c8 [4];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  float local_1048 [4];
  undefined1 local_1038 [16];
  float local_1028 [4];
  float local_1018 [4];
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11b0 = context;
    pauVar29 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar87 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar48 = (ray->super_RayK<1>).org.field_0.m128[1];
    auVar71._0_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar88 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar35 = (ray->super_RayK<1>).tfar;
    fVar96 = 0.0;
    if (0.0 <= fVar35) {
      fVar96 = fVar35;
    }
    auVar36._4_4_ = -(uint)(ABS(aVar7.y) < DAT_01f4bd50._4_4_);
    auVar36._0_4_ = -(uint)(ABS(aVar7.x) < (float)DAT_01f4bd50);
    auVar36._8_4_ = -(uint)(ABS(aVar7.z) < DAT_01f4bd50._8_4_);
    auVar36._12_4_ = -(uint)(ABS(aVar7.field_3.w) < DAT_01f4bd50._12_4_);
    auVar69 = blendvps((undefined1  [16])aVar7,_DAT_01f4bd50,auVar36);
    fVar35 = 0.0;
    if (0.0 <= fVar88) {
      fVar35 = fVar88;
    }
    auVar36 = rcpps(auVar36,auVar69);
    fVar94 = auVar36._0_4_;
    fVar97 = auVar36._4_4_;
    fVar99 = auVar36._8_4_;
    fVar94 = (1.0 - auVar69._0_4_ * fVar94) * fVar94 + fVar94;
    fVar97 = (1.0 - auVar69._4_4_ * fVar97) * fVar97 + fVar97;
    fVar99 = (1.0 - auVar69._8_4_ * fVar99) * fVar99 + fVar99;
    uVar28 = (ulong)(fVar94 < 0.0) << 4;
    uVar26 = (ulong)(fVar97 < 0.0) << 4 | 0x20;
    uVar24 = (ulong)(fVar99 < 0.0) << 4 | 0x40;
    uVar30 = uVar28 ^ 0x10;
    _local_1008 = mm_lookupmask_ps._240_8_;
    _uStack_1000 = mm_lookupmask_ps._248_8_;
    local_f98 = auVar71._0_4_;
    fStack_f94 = auVar71._0_4_;
    fStack_f90 = auVar71._0_4_;
    fStack_f8c = auVar71._0_4_;
    local_fa8 = fVar35;
    fStack_fa4 = fVar35;
    fStack_fa0 = fVar35;
    fStack_f9c = fVar35;
    local_fb8 = fVar99;
    fStack_fb4 = fVar99;
    fStack_fb0 = fVar99;
    fStack_fac = fVar99;
    local_fc8 = fVar87;
    fStack_fc4 = fVar87;
    fStack_fc0 = fVar87;
    fStack_fbc = fVar87;
    local_fd8 = fVar48;
    fStack_fd4 = fVar48;
    fStack_fd0 = fVar48;
    fStack_fcc = fVar48;
    local_fe8 = fVar94;
    fStack_fe4 = fVar94;
    fStack_fe0 = fVar94;
    fStack_fdc = fVar94;
    local_ff8 = fVar97;
    fStack_ff4 = fVar97;
    fStack_ff0 = fVar97;
    fStack_fec = fVar97;
    fVar88 = auVar71._0_4_;
    fVar91 = auVar71._0_4_;
    fVar89 = auVar71._0_4_;
    fVar92 = fVar35;
    fVar90 = fVar35;
    fVar93 = fVar35;
    fVar102 = fVar99;
    fVar100 = fVar99;
    fVar103 = fVar99;
    fVar105 = fVar87;
    fVar53 = fVar87;
    fVar58 = fVar87;
    fVar59 = fVar48;
    fVar60 = fVar48;
    fVar73 = fVar48;
    fVar76 = fVar94;
    fVar77 = fVar94;
    fVar81 = fVar94;
    fVar85 = fVar97;
    fVar86 = fVar97;
    fVar95 = fVar97;
    fVar98 = fVar96;
    fVar101 = fVar96;
    fVar104 = fVar96;
LAB_00680088:
    if (pauVar29 != (undefined1 (*) [16])&local_f78) {
      pauVar18 = pauVar29 + -1;
      pauVar29 = pauVar29 + -1;
      pfVar5 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar18 + 8) < *pfVar5 || *(float *)((long)*pauVar18 + 8) == *pfVar5) {
        pauVar18 = (undefined1 (*) [16])&local_f78;
        pauVar31 = *(undefined1 (**) [16])*pauVar29;
        while (((ulong)pauVar31 & 8) == 0) {
          pfVar5 = (float *)((long)pauVar31[2] + uVar28);
          fVar33 = (*pfVar5 - fVar87) * fVar94;
          fVar46 = (pfVar5[1] - fVar105) * fVar76;
          fVar49 = (pfVar5[2] - fVar53) * fVar77;
          fVar51 = (pfVar5[3] - fVar58) * fVar81;
          pfVar5 = (float *)((long)pauVar31[2] + uVar26);
          fVar61 = (*pfVar5 - fVar48) * fVar97;
          fVar63 = (pfVar5[1] - fVar59) * fVar85;
          fVar65 = (pfVar5[2] - fVar60) * fVar86;
          fVar67 = (pfVar5[3] - fVar73) * fVar95;
          uVar62 = (uint)((int)fVar61 < (int)fVar33) * (int)fVar33 |
                   (uint)((int)fVar61 >= (int)fVar33) * (int)fVar61;
          uVar64 = (uint)((int)fVar63 < (int)fVar46) * (int)fVar46 |
                   (uint)((int)fVar63 >= (int)fVar46) * (int)fVar63;
          uVar66 = (uint)((int)fVar65 < (int)fVar49) * (int)fVar49 |
                   (uint)((int)fVar65 >= (int)fVar49) * (int)fVar65;
          uVar68 = (uint)((int)fVar67 < (int)fVar51) * (int)fVar51 |
                   (uint)((int)fVar67 >= (int)fVar51) * (int)fVar67;
          pfVar5 = (float *)((long)pauVar31[2] + uVar24);
          fVar33 = (*pfVar5 - auVar71._0_4_) * fVar99;
          fVar46 = (pfVar5[1] - fVar88) * fVar102;
          fVar49 = (pfVar5[2] - fVar91) * fVar100;
          fVar51 = (pfVar5[3] - fVar89) * fVar103;
          uVar34 = (uint)((int)fVar33 < (int)fVar35) * (int)fVar35 |
                   (uint)((int)fVar33 >= (int)fVar35) * (int)fVar33;
          uVar47 = (uint)((int)fVar46 < (int)fVar92) * (int)fVar92 |
                   (uint)((int)fVar46 >= (int)fVar92) * (int)fVar46;
          uVar50 = (uint)((int)fVar49 < (int)fVar90) * (int)fVar90 |
                   (uint)((int)fVar49 >= (int)fVar90) * (int)fVar49;
          uVar52 = (uint)((int)fVar51 < (int)fVar93) * (int)fVar93 |
                   (uint)((int)fVar51 >= (int)fVar93) * (int)fVar51;
          local_10c8[0] =
               (float)(((int)uVar34 < (int)uVar62) * uVar62 | ((int)uVar34 >= (int)uVar62) * uVar34)
          ;
          local_10c8[1] =
               (float)(((int)uVar47 < (int)uVar64) * uVar64 | ((int)uVar47 >= (int)uVar64) * uVar47)
          ;
          local_10c8[2] =
               (float)(((int)uVar50 < (int)uVar66) * uVar66 | ((int)uVar50 >= (int)uVar66) * uVar50)
          ;
          local_10c8[3] =
               (float)(((int)uVar52 < (int)uVar68) * uVar68 | ((int)uVar52 >= (int)uVar68) * uVar52)
          ;
          pfVar5 = (float *)((long)pauVar31[2] + uVar30);
          fVar33 = (*pfVar5 - fVar87) * fVar94;
          fVar46 = (pfVar5[1] - fVar105) * fVar76;
          fVar49 = (pfVar5[2] - fVar53) * fVar77;
          fVar51 = (pfVar5[3] - fVar58) * fVar81;
          pfVar5 = (float *)((long)pauVar31[2] + (uVar26 ^ 0x10));
          fVar61 = (*pfVar5 - fVar48) * fVar97;
          fVar63 = (pfVar5[1] - fVar59) * fVar85;
          fVar65 = (pfVar5[2] - fVar60) * fVar86;
          fVar67 = (pfVar5[3] - fVar73) * fVar95;
          uVar62 = (uint)((int)fVar33 < (int)fVar61) * (int)fVar33 |
                   (uint)((int)fVar33 >= (int)fVar61) * (int)fVar61;
          uVar64 = (uint)((int)fVar46 < (int)fVar63) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar63) * (int)fVar63;
          uVar66 = (uint)((int)fVar49 < (int)fVar65) * (int)fVar49 |
                   (uint)((int)fVar49 >= (int)fVar65) * (int)fVar65;
          uVar68 = (uint)((int)fVar51 < (int)fVar67) * (int)fVar51 |
                   (uint)((int)fVar51 >= (int)fVar67) * (int)fVar67;
          pfVar5 = (float *)((long)pauVar31[2] + (uVar24 ^ 0x10));
          fVar33 = (*pfVar5 - auVar71._0_4_) * fVar99;
          fVar46 = (pfVar5[1] - fVar88) * fVar102;
          fVar49 = (pfVar5[2] - fVar91) * fVar100;
          fVar51 = (pfVar5[3] - fVar89) * fVar103;
          uVar34 = (uint)((int)fVar96 < (int)fVar33) * (int)fVar96 |
                   (uint)((int)fVar96 >= (int)fVar33) * (int)fVar33;
          uVar47 = (uint)((int)fVar98 < (int)fVar46) * (int)fVar98 |
                   (uint)((int)fVar98 >= (int)fVar46) * (int)fVar46;
          uVar50 = (uint)((int)fVar101 < (int)fVar49) * (int)fVar101 |
                   (uint)((int)fVar101 >= (int)fVar49) * (int)fVar49;
          uVar52 = (uint)((int)fVar104 < (int)fVar51) * (int)fVar104 |
                   (uint)((int)fVar104 >= (int)fVar51) * (int)fVar51;
          auVar69._0_4_ =
               -(uint)((int)(((int)uVar62 < (int)uVar34) * uVar62 |
                            ((int)uVar62 >= (int)uVar34) * uVar34) < (int)local_10c8[0]);
          auVar69._4_4_ =
               -(uint)((int)(((int)uVar64 < (int)uVar47) * uVar64 |
                            ((int)uVar64 >= (int)uVar47) * uVar47) < (int)local_10c8[1]);
          auVar69._8_4_ =
               -(uint)((int)(((int)uVar66 < (int)uVar50) * uVar66 |
                            ((int)uVar66 >= (int)uVar50) * uVar50) < (int)local_10c8[2]);
          auVar69._12_4_ =
               -(uint)((int)(((int)uVar68 < (int)uVar52) * uVar68 |
                            ((int)uVar68 >= (int)uVar52) * uVar52) < (int)local_10c8[3]);
          iVar17 = movmskps((int)pauVar18,auVar69);
          if (iVar17 == 0xf) goto LAB_00680088;
          bVar16 = (byte)iVar17 ^ 0xf;
          uVar32 = (ulong)pauVar31 & 0xfffffffffffffff0;
          lVar27 = 0;
          if (bVar16 != 0) {
            for (; (bVar16 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          pauVar18 = *(undefined1 (**) [16])(uVar32 + lVar27 * 8);
          uVar34 = bVar16 - 1 & (uint)bVar16;
          pauVar31 = pauVar18;
          if (uVar34 != 0) {
            fVar33 = local_10c8[lVar27];
            lVar27 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            pauVar31 = *(undefined1 (**) [16])(uVar32 + lVar27 * 8);
            fVar46 = local_10c8[lVar27];
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              if ((uint)fVar33 < (uint)fVar46) {
                *(undefined1 (**) [16])*pauVar29 = pauVar31;
                *(float *)((long)*pauVar29 + 8) = fVar46;
                pauVar29 = pauVar29 + 1;
                pauVar31 = pauVar18;
              }
              else {
                *(undefined1 (**) [16])*pauVar29 = pauVar18;
                *(float *)((long)*pauVar29 + 8) = fVar33;
                pauVar18 = pauVar31;
                pauVar29 = pauVar29 + 1;
              }
            }
            else {
              auVar75._8_4_ = fVar33;
              auVar75._0_8_ = pauVar18;
              auVar75._12_4_ = 0;
              auVar79._8_4_ = fVar46;
              auVar79._0_8_ = pauVar31;
              auVar79._12_4_ = 0;
              lVar27 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              uVar20 = *(undefined8 *)(uVar32 + lVar27 * 8);
              fVar49 = local_10c8[lVar27];
              auVar83._8_4_ = fVar49;
              auVar83._0_8_ = uVar20;
              auVar83._12_4_ = 0;
              auVar80._8_4_ = -(uint)((int)fVar33 < (int)fVar46);
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                auVar80._4_4_ = auVar80._8_4_;
                auVar80._0_4_ = auVar80._8_4_;
                auVar80._12_4_ = auVar80._8_4_;
                auVar78._8_4_ = fVar46;
                auVar78._0_8_ = pauVar31;
                auVar78._12_4_ = 0;
                auVar69 = blendvps(auVar78,auVar75,auVar80);
                auVar36 = blendvps(auVar75,auVar79,auVar80);
                auVar37._8_4_ = -(uint)(auVar69._8_4_ < (int)fVar49);
                auVar37._4_4_ = auVar37._8_4_;
                auVar37._0_4_ = auVar37._8_4_;
                auVar37._12_4_ = auVar37._8_4_;
                auVar74._8_4_ = fVar49;
                auVar74._0_8_ = uVar20;
                auVar74._12_4_ = 0;
                auVar75 = blendvps(auVar74,auVar69,auVar37);
                auVar79 = blendvps(auVar69,auVar83,auVar37);
                auVar38._8_4_ = -(uint)(auVar36._8_4_ < auVar79._8_4_);
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar69 = blendvps(auVar79,auVar36,auVar38);
                auVar36 = blendvps(auVar36,auVar79,auVar38);
                *pauVar29 = auVar36;
                pauVar29[1] = auVar69;
                pauVar18 = auVar75._0_8_;
                pauVar29 = pauVar29 + 2;
                pauVar31 = pauVar18;
              }
              else {
                lVar27 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                auVar39._4_4_ = auVar80._8_4_;
                auVar39._0_4_ = auVar80._8_4_;
                auVar39._8_4_ = auVar80._8_4_;
                auVar39._12_4_ = auVar80._8_4_;
                auVar80 = blendvps(auVar79,auVar75,auVar39);
                auVar36 = blendvps(auVar75,auVar79,auVar39);
                auVar82._8_4_ = local_10c8[lVar27];
                auVar82._0_8_ = *(undefined8 *)(uVar32 + lVar27 * 8);
                auVar82._12_4_ = 0;
                auVar40._8_4_ = -(uint)((int)fVar49 < (int)local_10c8[lVar27]);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar75 = blendvps(auVar82,auVar83,auVar40);
                auVar69 = blendvps(auVar83,auVar82,auVar40);
                auVar41._8_4_ = -(uint)(auVar36._8_4_ < auVar69._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar83 = blendvps(auVar69,auVar36,auVar41);
                auVar36 = blendvps(auVar36,auVar69,auVar41);
                auVar42._8_4_ = -(uint)(auVar80._8_4_ < auVar75._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar69 = blendvps(auVar75,auVar80,auVar42);
                auVar79 = blendvps(auVar80,auVar75,auVar42);
                auVar43._8_4_ = -(uint)(auVar79._8_4_ < auVar83._8_4_);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar75 = blendvps(auVar83,auVar79,auVar43);
                auVar79 = blendvps(auVar79,auVar83,auVar43);
                *pauVar29 = auVar36;
                pauVar29[1] = auVar79;
                pauVar29[2] = auVar75;
                pauVar18 = auVar69._0_8_;
                pauVar29 = pauVar29 + 3;
                pauVar31 = pauVar18;
              }
            }
          }
        }
        local_1160 = (ulong)((uint)pauVar31 & 0xf) - 8;
        uVar32 = (ulong)pauVar31 & 0xfffffffffffffff0;
        lVar27 = 0;
        while (lVar27 != local_1160) {
          lVar19 = lVar27 * 0x50;
          pSVar25 = local_11b0->scene;
          ppfVar9 = (pSVar25->vertices).items;
          pfVar10 = ppfVar9[*(uint *)(uVar32 + 0x30 + lVar19)];
          pfVar5 = pfVar10 + *(uint *)(uVar32 + lVar19);
          fVar35 = *pfVar5;
          fVar96 = pfVar5[1];
          fVar87 = pfVar5[2];
          pfVar5 = pfVar10 + *(uint *)(uVar32 + 0x10 + lVar19);
          pfVar10 = pfVar10 + *(uint *)(uVar32 + 0x20 + lVar19);
          pfVar11 = ppfVar9[*(uint *)(uVar32 + 0x34 + lVar19)];
          pfVar1 = pfVar11 + *(uint *)(uVar32 + 4 + lVar19);
          fVar48 = *pfVar1;
          auVar71._0_4_ = pfVar1[1];
          fVar88 = pfVar1[2];
          pfVar1 = pfVar11 + *(uint *)(uVar32 + 0x14 + lVar19);
          pfVar11 = pfVar11 + *(uint *)(uVar32 + 0x24 + lVar19);
          pfVar12 = ppfVar9[*(uint *)(uVar32 + 0x38 + lVar19)];
          pfVar2 = pfVar12 + *(uint *)(uVar32 + 8 + lVar19);
          fStack_1180 = *pfVar2;
          fVar91 = pfVar2[1];
          fVar89 = pfVar2[2];
          pfVar2 = pfVar12 + *(uint *)(uVar32 + 0x18 + lVar19);
          pfVar12 = pfVar12 + *(uint *)(uVar32 + 0x28 + lVar19);
          pfVar13 = ppfVar9[*(uint *)(uVar32 + 0x3c + lVar19)];
          pfVar3 = pfVar13 + *(uint *)(uVar32 + 0xc + lVar19);
          fStack_117c = *pfVar3;
          fVar92 = pfVar3[1];
          fVar90 = pfVar3[2];
          pfVar3 = pfVar13 + *(uint *)(uVar32 + 0x1c + lVar19);
          pfVar4 = pfVar13 + *(uint *)(uVar32 + 0x2c + lVar19);
          puVar6 = (undefined8 *)(uVar32 + 0x30 + lVar19);
          local_f88 = *puVar6;
          uStack_f80 = puVar6[1];
          puVar6 = (undefined8 *)(uVar32 + 0x40 + lVar19);
          local_10d8 = *puVar6;
          uStack_10d0 = puVar6[1];
          local_1198 = fVar35 - *pfVar5;
          fStack_1194 = fVar48 - *pfVar1;
          fStack_1190 = fStack_1180 - *pfVar2;
          fStack_118c = fStack_117c - *pfVar3;
          fVar95 = fVar96 - pfVar5[1];
          fVar98 = auVar71._0_4_ - pfVar1[1];
          fVar101 = fVar91 - pfVar2[1];
          fVar104 = fVar92 - pfVar3[1];
          fVar46 = fVar87 - pfVar5[2];
          fVar49 = fVar88 - pfVar1[2];
          fVar51 = fVar89 - pfVar2[2];
          fVar61 = fVar90 - pfVar3[2];
          fVar53 = *pfVar10 - fVar35;
          fVar58 = *pfVar11 - fVar48;
          fVar59 = *pfVar12 - fStack_1180;
          fVar60 = *pfVar4 - fStack_117c;
          fVar81 = pfVar10[1] - fVar96;
          fVar97 = pfVar11[1] - auVar71._0_4_;
          fVar85 = pfVar12[1] - fVar91;
          fVar86 = pfVar4[1] - fVar92;
          fVar73 = pfVar10[2] - fVar87;
          fVar94 = pfVar11[2] - fVar88;
          fVar76 = pfVar12[2] - fVar89;
          fVar77 = pfVar4[2] - fVar90;
          local_11d8._0_4_ = fVar46 * fVar81 - fVar95 * fVar73;
          local_11d8._4_4_ = fVar49 * fVar97 - fVar98 * fVar94;
          local_11d8._8_4_ = fVar51 * fVar85 - fVar101 * fVar76;
          local_11d8._12_4_ = fVar61 * fVar86 - fVar104 * fVar77;
          fVar93 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar99 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar102 = (ray->super_RayK<1>).org.field_0.m128[2];
          fVar100 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar103 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar105 = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar35 = fVar35 - fVar93;
          fVar48 = fVar48 - fVar93;
          fStack_1180 = fStack_1180 - fVar93;
          fStack_117c = fStack_117c - fVar93;
          local_11a8._0_4_ = fVar96 - fVar99;
          local_11a8._4_4_ = auVar71._0_4_ - fVar99;
          local_11a8._8_4_ = fVar91 - fVar99;
          local_11a8._12_4_ = fVar92 - fVar99;
          fVar107 = fVar35 * fVar103 - local_11a8._0_4_ * fVar100;
          fVar108 = fVar48 * fVar103 - local_11a8._4_4_ * fVar100;
          fVar109 = fStack_1180 * fVar103 - local_11a8._8_4_ * fVar100;
          fVar110 = fStack_117c * fVar103 - local_11a8._12_4_ * fVar100;
          local_1028[0] = local_1198 * fVar73 - fVar46 * fVar53;
          local_1028[1] = fStack_1194 * fVar94 - fVar49 * fVar58;
          local_1028[2] = fStack_1190 * fVar76 - fVar51 * fVar59;
          local_1028[3] = fStack_118c * fVar77 - fVar61 * fVar60;
          fVar87 = fVar87 - fVar102;
          fVar88 = fVar88 - fVar102;
          fVar89 = fVar89 - fVar102;
          fVar90 = fVar90 - fVar102;
          local_1188 = CONCAT44(fVar48,fVar35);
          fVar63 = fVar87 * fVar100 - fVar35 * fVar105;
          fVar65 = fVar88 * fVar100 - fVar48 * fVar105;
          fVar67 = fVar89 * fVar100 - fStack_1180 * fVar105;
          fVar106 = fVar90 * fVar100 - fStack_117c * fVar105;
          local_1018[0] = fVar95 * fVar53 - local_1198 * fVar81;
          local_1018[1] = fVar98 * fVar58 - fStack_1194 * fVar97;
          local_1018[2] = fVar101 * fVar59 - fStack_1190 * fVar85;
          local_1018[3] = fVar104 * fVar60 - fStack_118c * fVar86;
          fVar96 = local_11a8._0_4_ * fVar105 - fVar87 * fVar103;
          auVar71._0_4_ = local_11a8._4_4_ * fVar105 - fVar88 * fVar103;
          fVar102 = local_11a8._8_4_ * fVar105 - fVar89 * fVar103;
          fVar33 = local_11a8._12_4_ * fVar105 - fVar90 * fVar103;
          fVar91 = fVar100 * local_11d8._0_4_ + fVar103 * local_1028[0] + fVar105 * local_1018[0];
          fVar92 = fVar100 * local_11d8._4_4_ + fVar103 * local_1028[1] + fVar105 * local_1018[1];
          fVar93 = fVar100 * local_11d8._8_4_ + fVar103 * local_1028[2] + fVar105 * local_1018[2];
          fVar99 = fVar100 * local_11d8._12_4_ + fVar103 * local_1028[3] + fVar105 * local_1018[3];
          uVar34 = (uint)fVar91 & 0x80000000;
          uVar47 = (uint)fVar92 & 0x80000000;
          uVar50 = (uint)fVar93 & 0x80000000;
          uVar52 = (uint)fVar99 & 0x80000000;
          local_10c8[0] =
               (float)((uint)(fVar53 * fVar96 + fVar81 * fVar63 + fVar73 * fVar107) ^ uVar34);
          local_10c8[1] =
               (float)((uint)(fVar58 * auVar71._0_4_ + fVar97 * fVar65 + fVar94 * fVar108) ^ uVar47)
          ;
          local_10c8[2] =
               (float)((uint)(fVar59 * fVar102 + fVar85 * fVar67 + fVar76 * fVar109) ^ uVar50);
          local_10c8[3] =
               (float)((uint)(fVar60 * fVar33 + fVar86 * fVar106 + fVar77 * fVar110) ^ uVar52);
          local_10b8 = (float)((uint)(fVar96 * local_1198 + fVar63 * fVar95 + fVar107 * fVar46) ^
                              uVar34);
          fStack_10b4 = (float)((uint)(auVar71._0_4_ * fStack_1194 +
                                      fVar65 * fVar98 + fVar108 * fVar49) ^ uVar47);
          fStack_10b0 = (float)((uint)(fVar102 * fStack_1190 + fVar67 * fVar101 + fVar109 * fVar51)
                               ^ uVar50);
          fStack_10ac = (float)((uint)(fVar33 * fStack_118c + fVar106 * fVar104 + fVar110 * fVar61)
                               ^ uVar52);
          fVar96 = ABS(fVar91);
          auVar71._0_4_ = ABS(fVar92);
          local_1098._0_8_ = CONCAT44(fVar92,fVar91) & 0x7fffffff7fffffff;
          local_1098._8_4_ = ABS(fVar93);
          local_1098._12_4_ = ABS(fVar99);
          auVar84._0_4_ =
               -(uint)(local_10c8[0] + local_10b8 <= fVar96) &
               -(uint)((0.0 <= local_10b8 && 0.0 <= local_10c8[0]) && fVar91 != 0.0) & local_1008;
          auVar84._4_4_ =
               -(uint)(local_10c8[1] + fStack_10b4 <= auVar71._0_4_) &
               -(uint)((0.0 <= fStack_10b4 && 0.0 <= local_10c8[1]) && fVar92 != 0.0) & uStack_1004;
          auVar84._8_4_ =
               -(uint)(local_10c8[2] + fStack_10b0 <= local_1098._8_4_) &
               -(uint)((0.0 <= fStack_10b0 && 0.0 <= local_10c8[2]) && fVar93 != 0.0) & uStack_1000;
          auVar84._12_4_ =
               -(uint)(local_10c8[3] + fStack_10ac <= local_1098._12_4_) &
               -(uint)((0.0 <= fStack_10ac && 0.0 <= local_10c8[3]) && fVar99 != 0.0) & uStack_ffc;
          iVar17 = movmskps((int)lVar19,auVar84);
          local_1188 = lVar27;
          if (iVar17 != 0) {
            local_10a8 = (float)(uVar34 ^ (uint)(fVar35 * local_11d8._0_4_ +
                                                local_11a8._0_4_ * local_1028[0] +
                                                fVar87 * local_1018[0]));
            fStack_10a4 = (float)(uVar47 ^ (uint)(fVar48 * local_11d8._4_4_ +
                                                 local_11a8._4_4_ * local_1028[1] +
                                                 fVar88 * local_1018[1]));
            fStack_10a0 = (float)(uVar50 ^ (uint)(fStack_1180 * local_11d8._8_4_ +
                                                 local_11a8._8_4_ * local_1028[2] +
                                                 fVar89 * local_1018[2]));
            fStack_109c = (float)(uVar52 ^ (uint)(fStack_117c * local_11d8._12_4_ +
                                                 local_11a8._12_4_ * local_1028[3] +
                                                 fVar90 * local_1018[3]));
            fVar35 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar8._0_4_ = (ray->super_RayK<1>).tfar;
            auVar8._4_4_ = (ray->super_RayK<1>).mask;
            auVar8._8_4_ = (ray->super_RayK<1>).id;
            auVar8._12_4_ = (ray->super_RayK<1>).flags;
            auVar44._0_4_ =
                 -(uint)(local_10a8 <= (float)auVar8._0_4_ * fVar96 && fVar35 * fVar96 < local_10a8)
                 & auVar84._0_4_;
            auVar44._4_4_ =
                 -(uint)(fStack_10a4 <= (float)auVar8._0_4_ * auVar71._0_4_ &&
                        fVar35 * auVar71._0_4_ < fStack_10a4) & auVar84._4_4_;
            auVar44._8_4_ =
                 -(uint)(fStack_10a0 <= (float)auVar8._0_4_ * local_1098._8_4_ &&
                        fVar35 * local_1098._8_4_ < fStack_10a0) & auVar84._8_4_;
            auVar44._12_4_ =
                 -(uint)(fStack_109c <= (float)auVar8._0_4_ * local_1098._12_4_ &&
                        fVar35 * local_1098._12_4_ < fStack_109c) & auVar84._12_4_;
            iVar17 = movmskps(iVar17,auVar44);
            if (iVar17 != 0) {
              local_1198 = SUB84(pSVar25,0);
              fStack_1194 = (float)((ulong)pSVar25 >> 0x20);
              local_1078 = auVar44;
              local_1038 = local_11d8;
              local_11c8 = auVar44;
              auVar36 = rcpps(local_11d8,local_1098);
              fVar88 = auVar36._0_4_;
              fVar91 = auVar36._4_4_;
              fVar89 = auVar36._8_4_;
              fVar92 = auVar36._12_4_;
              fVar88 = (1.0 - fVar96 * fVar88) * fVar88 + fVar88;
              fVar91 = (1.0 - auVar71._0_4_ * fVar91) * fVar91 + fVar91;
              fVar89 = (1.0 - local_1098._8_4_ * fVar89) * fVar89 + fVar89;
              fVar92 = (1.0 - local_1098._12_4_ * fVar92) * fVar92 + fVar92;
              fVar35 = local_10a8 * fVar88;
              fVar96 = fStack_10a4 * fVar91;
              fVar87 = fStack_10a0 * fVar89;
              fVar48 = fStack_109c * fVar92;
              local_1048[0] = fVar35;
              local_1048[1] = fVar96;
              local_1048[2] = fVar87;
              local_1048[3] = fVar48;
              local_1068[0] = local_10c8[0] * fVar88;
              local_1068[1] = local_10c8[1] * fVar91;
              local_1068[2] = local_10c8[2] * fVar89;
              local_1068[3] = local_10c8[3] * fVar92;
              local_1058[0] = fVar88 * local_10b8;
              local_1058[1] = fVar91 * fStack_10b4;
              local_1058[2] = fVar89 * fStack_10b0;
              local_1058[3] = fVar92 * fStack_10ac;
              auVar14._4_4_ = fVar96;
              auVar14._0_4_ = fVar35;
              auVar14._8_4_ = fVar87;
              auVar14._12_4_ = fVar48;
              auVar36 = blendvps(_DAT_01f45a30,auVar14,auVar44);
              auVar70._4_4_ = auVar36._0_4_;
              auVar70._0_4_ = auVar36._4_4_;
              auVar70._8_4_ = auVar36._12_4_;
              auVar70._12_4_ = auVar36._8_4_;
              auVar71 = minps(auVar70,auVar36);
              auVar54._0_8_ = auVar71._8_8_;
              auVar54._8_4_ = auVar71._0_4_;
              auVar54._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar54,auVar71);
              auVar55._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar36._4_4_) & auVar44._4_4_,
                            -(uint)(auVar71._0_4_ == auVar36._0_4_) & auVar44._0_4_);
              auVar55._8_4_ = -(uint)(auVar71._8_4_ == auVar36._8_4_) & auVar44._8_4_;
              auVar55._12_4_ = -(uint)(auVar71._12_4_ == auVar36._12_4_) & auVar44._12_4_;
              iVar17 = movmskps(iVar17,auVar55);
              if (iVar17 != 0) {
                auVar44._8_4_ = auVar55._8_4_;
                auVar44._0_8_ = auVar55._0_8_;
                auVar44._12_4_ = auVar55._12_4_;
              }
              uVar20 = extractps(auVar8,1);
              auVar71._4_4_ = movmskps((int)pfVar13,auVar44);
              uVar22 = CONCAT44((int)((ulong)pfVar13 >> 0x20),auVar71._4_4_);
              local_1168 = 0;
              auVar71._0_4_ = (float)auVar8._0_4_;
              auVar71._4_4_ = auVar8._4_4_;
              auVar71._8_4_ = auVar8._8_4_;
              auVar71._12_4_ = auVar8._12_4_;
              if (uVar22 != 0) {
                for (; (uVar22 >> local_1168 & 1) == 0; local_1168 = local_1168 + 1) {
                }
              }
LAB_00680784:
              local_1110 = *(uint *)((long)&local_f88 + local_1168 * 4);
              pGVar23 = (Geometry *)(ulong)local_1110;
              local_1170 = (pSVar25->geometries).items[(long)pGVar23].ptr;
              if ((local_1170->mask & (uint)uVar20) == 0) {
                *(undefined4 *)(local_11c8 + local_1168 * 4) = 0;
              }
              else {
                if (local_11b0->args->filter == (RTCFilterFunctionN)0x0) {
                  local_1158.context = local_11b0->user;
                  if (local_1170->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar35 = local_1068[local_1168];
                    fVar96 = local_1058[local_1168];
                    (ray->super_RayK<1>).tfar = local_1048[local_1168];
                    (ray->Ng).field_0.field_0.x = local_1028[local_1168 + -4];
                    (ray->Ng).field_0.field_0.y = local_1028[local_1168];
                    (ray->Ng).field_0.field_0.z = local_1018[local_1168];
                    ray->u = fVar35;
                    ray->v = fVar96;
                    ray->primID = *(uint *)((long)&local_10d8 + local_1168 * 4);
                    ray->geomID = local_1110;
                    ray->instID[0] = (local_1158.context)->instID[0];
                    ray->instPrimID[0] = (local_1158.context)->instPrimID[0];
                    goto LAB_0068060d;
                  }
                  local_10f8 = auVar71._0_4_;
                  uStack_10f4 = auVar71._4_4_;
                  uStack_10f0 = auVar71._8_4_;
                  uStack_10ec = auVar71._12_4_;
                  local_10e8 = fVar35;
                  fStack_10e4 = fVar96;
                  fStack_10e0 = fVar87;
                  fStack_10dc = fVar48;
                }
                else {
                  local_10f8 = auVar71._0_4_;
                  uStack_10f4 = auVar71._4_4_;
                  uStack_10f0 = auVar71._8_4_;
                  uStack_10ec = auVar71._12_4_;
                  local_10e8 = fVar35;
                  fStack_10e4 = fVar96;
                  fStack_10e0 = fVar87;
                  fStack_10dc = fVar48;
                  local_1158.context = local_11b0->user;
                }
                local_11a8._0_8_ = uVar28;
                local_11d8._0_8_ = local_11b0->args;
                local_1128 = local_1028[local_1168 + -4];
                local_1124 = local_1028[local_1168];
                local_1120 = local_1018[local_1168];
                local_111c = local_1068[local_1168];
                local_1118 = local_1058[local_1168];
                local_1114 = *(undefined4 *)((long)&local_10d8 + local_1168 * 4);
                local_110c = (local_1158.context)->instID[0];
                local_1108 = (local_1158.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_1048[local_1168];
                local_11dc = -1;
                local_1158.valid = &local_11dc;
                pGVar23 = (Geometry *)local_1170->userPtr;
                local_1158.geometryUserPtr = pGVar23;
                local_1158.ray = (RTCRayN *)ray;
                local_1158.hit = (RTCHitN *)&local_1128;
                local_1158.N = 1;
                local_10f8 = auVar71._0_4_;
                uStack_10f4 = auVar71._4_4_;
                uStack_10f0 = auVar71._8_4_;
                uStack_10ec = auVar71._12_4_;
                local_10e8 = fVar35;
                fStack_10e4 = fVar96;
                fStack_10e0 = fVar87;
                fStack_10dc = fVar48;
                if ((local_1170->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*local_1170->intersectionFilterN)(&local_1158), *local_1158.valid != 0)) {
                  if ((*(Device **)(local_11d8._0_8_ + 0x10) != (Device *)0x0) &&
                     (((pGVar23 = (Geometry *)local_11d8._0_8_,
                       ((ulong)((RefCount *)local_11d8._0_8_)->_vptr_RefCount & 2) != 0 ||
                       (pGVar23 = local_1170, ((local_1170->field_8).field_0x2 & 0x40) != 0)) &&
                      ((*(code *)*(Device **)(local_11d8._0_8_ + 0x10))(&local_1158),
                      *local_1158.valid == 0)))) goto LAB_00680a05;
                  (((Vec3f *)((long)local_1158.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1158.hit;
                  (((Vec3f *)((long)local_1158.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1158.hit + 4);
                  (((Vec3f *)((long)local_1158.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1158.hit + 8);
                  *(float *)((long)local_1158.ray + 0x3c) = *(float *)(local_1158.hit + 0xc);
                  *(float *)((long)local_1158.ray + 0x40) = *(float *)(local_1158.hit + 0x10);
                  *(float *)((long)local_1158.ray + 0x44) = *(float *)(local_1158.hit + 0x14);
                  *(float *)((long)local_1158.ray + 0x48) = *(float *)(local_1158.hit + 0x18);
                  *(float *)((long)local_1158.ray + 0x4c) = *(float *)(local_1158.hit + 0x1c);
                  pGVar23 = (Geometry *)(ulong)(uint)*(float *)(local_1158.hit + 0x20);
                  *(float *)((long)local_1158.ray + 0x50) = *(float *)(local_1158.hit + 0x20);
                }
                else {
LAB_00680a05:
                  (ray->super_RayK<1>).tfar = local_10f8;
                }
                *(undefined4 *)(local_11c8 + local_1168 * 4) = 0;
                auVar71._0_4_ = (ray->super_RayK<1>).tfar;
                auVar71._4_4_ = (ray->super_RayK<1>).mask;
                auVar71._8_4_ = (ray->super_RayK<1>).id;
                auVar71._12_4_ = (ray->super_RayK<1>).flags;
                local_11c8._0_4_ = -(uint)(local_10e8 <= auVar71._0_4_) & local_11c8._0_4_;
                local_11c8._4_4_ = -(uint)(fStack_10e4 <= auVar71._0_4_) & local_11c8._4_4_;
                local_11c8._8_4_ = -(uint)(fStack_10e0 <= auVar71._0_4_) & local_11c8._8_4_;
                local_11c8._12_4_ = -(uint)(fStack_10dc <= auVar71._0_4_) & local_11c8._12_4_;
                uVar20 = extractps(auVar71,1);
                pSVar25 = (Scene *)CONCAT44(fStack_1194,local_1198);
                uVar28 = local_11a8._0_8_;
                fVar35 = local_10e8;
                fVar96 = fStack_10e4;
                fVar87 = fStack_10e0;
                fVar48 = fStack_10dc;
              }
              iVar17 = movmskps((int)pGVar23,local_11c8);
              if (iVar17 == 0) goto LAB_0068060d;
              auVar15._4_4_ = fVar96;
              auVar15._0_4_ = fVar35;
              auVar15._8_4_ = fVar87;
              auVar15._12_4_ = fVar48;
              auVar69 = blendvps(_DAT_01f45a30,auVar15,local_11c8);
              auVar72._4_4_ = auVar69._0_4_;
              auVar72._0_4_ = auVar69._4_4_;
              auVar72._8_4_ = auVar69._12_4_;
              auVar72._12_4_ = auVar69._8_4_;
              auVar36 = minps(auVar72,auVar69);
              auVar56._0_8_ = auVar36._8_8_;
              auVar56._8_4_ = auVar36._0_4_;
              auVar56._12_4_ = auVar36._4_4_;
              auVar36 = minps(auVar56,auVar36);
              auVar57._0_8_ =
                   CONCAT44(-(uint)(auVar36._4_4_ == auVar69._4_4_) & local_11c8._4_4_,
                            -(uint)(auVar36._0_4_ == auVar69._0_4_) & local_11c8._0_4_);
              auVar57._8_4_ = -(uint)(auVar36._8_4_ == auVar69._8_4_) & local_11c8._8_4_;
              auVar57._12_4_ = -(uint)(auVar36._12_4_ == auVar69._12_4_) & local_11c8._12_4_;
              iVar17 = movmskps(iVar17,auVar57);
              auVar45 = local_11c8;
              if (iVar17 != 0) {
                auVar45._8_4_ = auVar57._8_4_;
                auVar45._0_8_ = auVar57._0_8_;
                auVar45._12_4_ = auVar57._12_4_;
              }
              uVar21 = movmskps(iVar17,auVar45);
              uVar22 = CONCAT44((int)((ulong)pGVar23 >> 0x20),uVar21);
              local_1168 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> local_1168 & 1) == 0; local_1168 = local_1168 + 1) {
                }
              }
              goto LAB_00680784;
            }
          }
LAB_0068060d:
          auVar71._0_4_ = local_f98;
          fVar88 = fStack_f94;
          fVar91 = fStack_f90;
          fVar89 = fStack_f8c;
          fVar35 = local_fa8;
          fVar92 = fStack_fa4;
          fVar90 = fStack_fa0;
          fVar93 = fStack_f9c;
          fVar99 = local_fb8;
          fVar102 = fStack_fb4;
          fVar100 = fStack_fb0;
          fVar103 = fStack_fac;
          fVar87 = local_fc8;
          fVar105 = fStack_fc4;
          fVar53 = fStack_fc0;
          fVar58 = fStack_fbc;
          fVar48 = local_fd8;
          fVar59 = fStack_fd4;
          fVar60 = fStack_fd0;
          fVar73 = fStack_fcc;
          fVar94 = local_fe8;
          fVar76 = fStack_fe4;
          fVar77 = fStack_fe0;
          fVar81 = fStack_fdc;
          fVar97 = local_ff8;
          fVar85 = fStack_ff4;
          fVar86 = fStack_ff0;
          fVar95 = fStack_fec;
          lVar27 = local_1188 + 1;
        }
        fVar96 = (ray->super_RayK<1>).tfar;
        fVar98 = fVar96;
        fVar101 = fVar96;
        fVar104 = fVar96;
      }
      goto LAB_00680088;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }